

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

uint32_t helper_bcdsr_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  _Bool _Var2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  _Bool ox_flag;
  ppc_avr_t ret;
  ppc_avr_t bcd_one;
  _Bool local_59;
  ppc_avr_t local_58;
  int local_40;
  int local_3c;
  ppc_avr_t local_38;
  
  local_59 = false;
  bVar4 = b->u8[0];
  local_58.u64[1] = b->u64[1];
  local_58.u64[0] = b->u64[0] & 0xfffffffffffffff0;
  cVar1 = a->s8[8];
  iVar7 = (int)cVar1;
  local_38.u64[1] = 0;
  local_38.u64[0] = 0x10;
  _Var2 = bcd_is_valid(b);
  if (!_Var2) {
    return 1;
  }
  if (cVar1 < ' ') {
    if (cVar1 < -0x1f) {
      iVar7 = -0x1f;
    }
    else if ('\0' < cVar1) goto LAB_00a95ec2;
    urshift(local_58.u64,local_58.u64 + 1,iVar7 * -4);
    if (4 < (local_58.u8[0] & 0xf)) {
      bcd_add_mag(&local_58,&local_58,&local_38,&local_40,&local_3c);
    }
  }
  else {
    iVar7 = 0x1f;
LAB_00a95ec2:
    ulshift(local_58.u64,local_58.u64 + 1,iVar7 << 2,&local_59);
  }
  bVar3 = 0xd;
  if (((bVar4 & 0xf) - 0xb & 0xfd) != 0) {
    bVar3 = (ps != 0) * '\x03' + 0xc;
  }
  bVar3 = local_58.u8[0] & 0xf0 | bVar3;
  local_58.u8[0] = bVar3;
  uVar5 = (ulong)bVar3;
  if ((local_58.u64[1] != 0) || (uVar6 = 2, uVar5 = local_58.u64[0], 0xf < local_58.u64[0])) {
    bVar4 = ((byte)uVar5 & 0xf) - 10;
    uVar6 = 8;
    if (bVar4 < 6) {
      uVar6 = *(uint *)(&DAT_00dac28c + (ulong)bVar4 * 4);
    }
  }
  r->u64[0] = local_58.u64[0];
  r->u64[1] = local_58.u64[1];
  return local_59 | uVar6;
}

Assistant:

uint32_t helper_bcdsr(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int unused = 0;
    int invalid = 0;
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    int i = a->VsrSB(7);
    ppc_avr_t bcd_one;

    bcd_one.VsrD(0) = 0;
    bcd_one.VsrD(1) = 0x10;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);

        if (bcd_get_digit(&ret, 0, &invalid) >= 5) {
            bcd_add_mag(&ret, &ret, &bcd_one, &invalid, &unused);
        }
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    cr = bcd_cmp_zero(&ret);
    if (ox_flag) {
        cr |= CRF_SO;
    }
    *r = ret;

    return cr;
}